

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

bool __thiscall QFileInfo::isRoot(QFileInfo *this)

{
  QFileInfoPrivate *this_00;
  bool bVar1;
  uint uVar2;
  
  this_00 = (this->d_ptr).d.ptr;
  if ((this_00->field_0x1db & 0x40) != 0) {
    return false;
  }
  if ((this_00->fileEngine)._M_t.
      super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
      super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
      super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl != (QAbstractFileEngine *)0x0
     ) {
    uVar2 = QFileInfoPrivate::getFileFlags(this_00,(FileFlags)0x800000);
    return uVar2 != 0;
  }
  bVar1 = QFileSystemEntry::isRoot(&this_00->fileEntry);
  return bVar1;
}

Assistant:

constexpr P get() const noexcept { return ptr; }